

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O2

void __thiscall
JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>::
Initialize(WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>
           *this,int capacity)

{
  undefined8 uVar1;
  uint uVar2;
  Recycler *pRVar3;
  int *ptr;
  WeakRefDictionaryEntry<Js::Type,_bool> *ptr_00;
  ulong uVar4;
  size_t count;
  ulong uVar5;
  undefined1 local_68 [8];
  TrackAllocData data;
  int local_34 [2];
  int modIndex;
  
  local_34[0] = 0x4b;
  uVar2 = PrimePolicy::GetPrime(capacity,local_34);
  count = (size_t)(int)uVar2;
  local_68 = (undefined1  [8])&int::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_18a073;
  data.filename._0_4_ = 0x1bd;
  data.plusSize = count;
  pRVar3 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_68);
  uVar4 = 0;
  ptr = Memory::AllocateArray<Memory::Recycler,int,false>
                  ((Memory *)pRVar3,(Recycler *)Memory::Recycler::AllocLeaf,0,count);
  local_68 = (undefined1  [8])&WeakRefDictionaryEntry<Js::Type,bool>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_18a073;
  data.filename._0_4_ = 0x1be;
  data.plusSize = count;
  data._32_8_ = this;
  pRVar3 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_68);
  ptr_00 = Memory::
           AllocateArray<Memory::Recycler,JsUtil::WeakRefDictionaryEntry<Js::Type,bool>,false>
                     ((Memory *)pRVar3,(Recycler *)Memory::Recycler::Alloc,0,count);
  uVar1 = data._32_8_;
  if (ptr_00 != (WeakRefDictionaryEntry<Js::Type,_bool> *)0x0 && ptr != (int *)0x0) {
    *(uint *)data._32_8_ = uVar2;
    Memory::WriteBarrierPtr<int>::WriteBarrierSet((WriteBarrierPtr<int> *)(data._32_8_ + 8),ptr);
    uVar5 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar5 = uVar4;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      ptr[uVar4] = -1;
    }
    Memory::WriteBarrierPtr<JsUtil::WeakRefDictionaryEntry<Js::Type,_bool>_>::WriteBarrierSet
              ((WriteBarrierPtr<JsUtil::WeakRefDictionaryEntry<Js::Type,_bool>_> *)(uVar1 + 0x10),
               ptr_00);
    *(undefined4 *)(uVar1 + 0x20) = 0xffffffff;
    *(int *)(uVar1 + 0x48) = local_34[0];
  }
  return;
}

Assistant:

void Initialize(int capacity)
        {
            int modIndex = UNKNOWN_MOD_INDEX;
            int size = PrimePolicy::GetSize(capacity, &modIndex);

            int* buckets = RecyclerNewArrayLeaf(recycler, int, size);
            EntryType * entries = RecyclerNewArray(recycler, EntryType, size);

            // No need for auto pointers here since these are both recycler
            // allocated objects
            if (buckets != nullptr && entries != nullptr)
            {
                this->size = size;
                this->buckets = buckets;
                for (int i = 0; i < size; i++) buckets[i] = -1;
                this->entries = entries;
                this->freeList = -1;
                this->modFunctionIndex = modIndex;
            }
        }